

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void __thiscall
glslang::TReflection::buildUniformStageMask(TReflection *this,TIntermediate *intermediate)

{
  EShLanguageMask EVar1;
  EShLanguage EVar2;
  size_type sVar3;
  reference pvVar4;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  TIntermediate *intermediate_local;
  TReflection *this_local;
  
  if ((this->options & EShReflectionAllBlockVariables) == EShReflectionDefault) {
    for (local_1c = 0;
        sVar3 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                ::size(&this->indexToUniform), local_1c < (int)sVar3; local_1c = local_1c + 1) {
      pvVar4 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ::operator[](&this->indexToUniform,(long)local_1c);
      EVar1 = pvVar4->stages;
      EVar2 = TIntermediate::getStage(intermediate);
      pvVar4 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ::operator[](&this->indexToUniform,(long)local_1c);
      pvVar4->stages = EVar1 | 1 << ((byte)EVar2 & 0x1f);
    }
    for (local_20 = 0;
        sVar3 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                ::size(&this->indexToBufferVariable), local_20 < (int)sVar3; local_20 = local_20 + 1
        ) {
      pvVar4 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ::operator[](&this->indexToBufferVariable,(long)local_20);
      EVar1 = pvVar4->stages;
      EVar2 = TIntermediate::getStage(intermediate);
      pvVar4 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ::operator[](&this->indexToBufferVariable,(long)local_20);
      pvVar4->stages = EVar1 | 1 << ((byte)EVar2 & 0x1f);
    }
  }
  return;
}

Assistant:

void TReflection::buildUniformStageMask(const TIntermediate& intermediate)
{
    if (options & EShReflectionAllBlockVariables)
        return;

    for (int i = 0; i < int(indexToUniform.size()); ++i) {
        indexToUniform[i].stages = static_cast<EShLanguageMask>(indexToUniform[i].stages | 1 << intermediate.getStage());
    }

    for (int i = 0; i < int(indexToBufferVariable.size()); ++i) {
        indexToBufferVariable[i].stages =
            static_cast<EShLanguageMask>(indexToBufferVariable[i].stages | 1 << intermediate.getStage());
    }
}